

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

void libevent_log_cb(int severity,char *msg)

{
  runtime_error *this;
  char **in_RCX;
  long in_FS_OFFSET;
  char *local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = msg;
  if (severity < 3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<char_const*>
              (&local_40,(tinyformat *)"libevent error: %s",(char *)&local_48,in_RCX);
    std::runtime_error::runtime_error(this,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void libevent_log_cb(int severity, const char *msg)
{
    // Ignore everything other than errors
    if (severity >= EVENT_LOG_ERR) {
        throw std::runtime_error(strprintf("libevent error: %s", msg));
    }
}